

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void optional_suite::test_value(void)

{
  string local_248 [40];
  undefined1 local_220 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  boost::optional<std::__cxx11::string>::optional<char_const(&)[6]>
            ((optional<std::__cxx11::string> *)local_220,(char (*) [6])"alpha",true);
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_220);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x166,"void optional_suite::test_value()",local_248,"\"alpha\"");
  std::__cxx11::string::~string(local_248);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_220);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_value()
{
    std::ostringstream result;
    json::oarchive ar(result);
    boost::optional<std::string> value("alpha");
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"alpha\"");
}